

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_sah_builder.h
# Opt level: O0

optional<unsigned_long> __thiscall
bvh::v2::BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL>::try_split
          (BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL> *this,BBox *bbox,size_t begin
          ,size_t end)

{
  float fVar1;
  Config *pCVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  anon_class_24_3_a16a3555 __pred;
  ulong axis_00;
  anon_class_32_4_337ade70 *this_00;
  undefined8 uVar5;
  reference pvVar6;
  reference bins;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  _Optional_payload_base<unsigned_long> _Var7;
  optional<unsigned_long> oVar8;
  size_t local_c68;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_c60;
  BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL> *local_c58;
  size_t *local_c50;
  float *local_c48;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_c40;
  unsigned_long *local_c38;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_c30;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_c28;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_c20;
  size_t local_c18;
  size_t index;
  float local_c08;
  size_t local_c00;
  float local_bf8;
  float local_bf4;
  size_t sStack_bf0;
  float split_pos;
  float local_be4;
  ulong uStack_be0;
  float leaf_cost;
  size_t axis_1;
  Split best_split;
  Vec<float,_3UL> local_bac;
  size_t local_ba0;
  size_t largest_axis;
  PerAxisBins per_axis_bins;
  size_t end_local;
  size_t begin_local;
  BBox *bbox_local;
  BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL> *this_local;
  bool local_870;
  Scalar local_868;
  undefined4 uStack_864;
  size_t *local_860;
  Scalar local_858;
  undefined4 uStack_854;
  BBox *local_850;
  anon_class_32_4_337ade70 local_848;
  undefined8 local_828;
  float local_820;
  undefined1 local_814 [8];
  Vec<float,_3UL> pos;
  size_t i;
  Vec<float,_3UL> local_7e0;
  undefined1 local_7d4 [8];
  Vec<float,_3UL> bin_offset;
  Vec<float,_3UL> local_7a8;
  Vec<float,_3UL> local_79c;
  undefined1 local_790 [8];
  Vec<float,_3UL> bin_scale;
  greater<float> local_6b1;
  Vec<float,_3UL> *local_6b0;
  BBox *local_6a8;
  size_t local_6a0;
  size_t local_698;
  Config *local_690;
  float local_688;
  uint local_684;
  float local_680;
  float local_67c;
  Vec<float,_3UL> *local_678;
  float local_670 [2];
  float local_668;
  float local_660 [2];
  float local_658;
  anon_class_16_2_94731e0a local_650;
  Vec<float,_3UL> *local_640;
  Vec<float,_3UL> *local_638;
  float local_630 [2];
  float local_628;
  undefined8 local_620;
  float local_618;
  undefined8 local_610;
  float local_608;
  anon_class_16_2_94731e0a local_600;
  Vec<float,_3UL> *local_5f0;
  Vec<float,_3UL> *local_5e8;
  undefined8 local_5e0;
  float local_5d8;
  float local_5d0 [2];
  float local_5c8;
  float local_5c0 [2];
  float local_5b8;
  anon_class_8_1_54a39801 local_5b0;
  BBox *local_5a8;
  float local_5a0 [2];
  float local_598;
  undefined8 local_590;
  float local_588;
  undefined8 local_580;
  float local_578;
  anon_class_24_3_4e94af79 local_570;
  Vec<float,_3UL> *local_558;
  Vec<float,_3UL> *local_550;
  reference local_548;
  undefined8 local_540;
  float local_538;
  anon_class_32_4_337ade70 *local_530;
  float local_528 [2];
  float local_520;
  anon_class_16_2_94732099 local_518;
  anon_class_16_2_94731e0a *local_508;
  undefined1 local_4fc [8];
  Vec<float,_3UL> v_1;
  anon_class_16_2_94732099 local_4c0;
  anon_class_16_2_94731e0a *local_4b0;
  undefined1 local_4a4 [8];
  Vec<float,_3UL> v_3;
  anon_class_16_2_94732099 local_468;
  anon_class_8_1_54a39801 *local_458;
  undefined1 local_44c [8];
  Vec<float,_3UL> v_2;
  anon_class_16_2_94732099 local_410;
  anon_class_24_3_4e94af79 *local_400;
  undefined1 local_3f4 [8];
  Vec<float,_3UL> v_4;
  anon_class_16_2_94731e0a local_390;
  BBox *local_380;
  Vec<float,_3UL> *local_378;
  size_t local_370;
  float local_368;
  size_t local_360;
  float local_358;
  size_t local_350;
  float local_348;
  anon_class_16_2_94731e0a local_340;
  BBox *local_330;
  Vec<float,_3UL> *local_328;
  size_t local_320;
  float local_318;
  float local_310 [2];
  float local_308;
  float local_300 [2];
  float local_2f8;
  anon_class_16_2_94731e0a local_2f0;
  BBox *local_2e0;
  Vec<float,_3UL> *local_2d8;
  float local_2d0 [2];
  float local_2c8;
  float local_2c0 [2];
  float local_2b8;
  anon_class_16_2_94732099 local_2b0;
  anon_class_16_2_94731e0a *local_2a0;
  undefined1 local_294 [8];
  Vec<float,_3UL> v;
  anon_class_16_2_94732099 local_278;
  anon_class_16_2_94731e0a *local_268;
  undefined1 local_25c [8];
  Vec<float,_3UL> v_7;
  anon_class_16_2_94732099 local_240;
  anon_class_16_2_94731e0a *local_230;
  undefined1 local_224 [8];
  Vec<float,_3UL> v_5;
  anon_class_24_3_cfb3b071 local_1b8;
  size_t local_1a0;
  size_t axis;
  Vec<float,_3UL> *local_190;
  anon_class_24_3_cfb3b071 *local_188;
  anon_class_24_3_cfb3b071 *local_180;
  anon_class_24_3_cfb3b071 *local_178;
  undefined8 local_170;
  float local_168;
  undefined8 local_15c;
  Vec<float,_3UL> d;
  anon_class_16_2_94731e0a local_a0;
  BBox *local_90;
  Vec<float,_3UL> *local_88;
  undefined8 local_80;
  float local_78;
  undefined8 local_70;
  float local_68;
  anon_class_16_2_94732099 local_60;
  anon_class_16_2_94731e0a *local_50;
  undefined1 local_44 [8];
  Vec<float,_3UL> v_6;
  
  per_axis_bins._M_elems[2]._M_elems[7].prim_count = end;
  std::
  array<std::array<bvh::v2::BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL>::Bin,_8UL>,_3UL>
  ::array((array<std::array<bvh::v2::BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL>::Bin,_8UL>,_3UL>
           *)&largest_axis);
  stack0xfffffffffffff880 = per_axis_bins._M_elems[2]._M_elems[7].prim_count;
  local_67c = 8.0;
  local_678 = &local_79c;
  std::fill<float*,float>(local_79c.values,(float *)local_790,&local_67c);
  local_2f0.a = &bbox->max;
  local_2b0.f = &local_2f0;
  local_2b0.v = (Vec<float,_3UL> *)local_294;
  local_2f0.b = &bbox->min;
  local_2e0 = bbox;
  local_2d8 = local_2f0.a;
  local_2a0 = local_2b0.f;
  Vec<float,_3UL>::
  generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
  ::anon_class_16_2_94732099::operator()(&local_2b0,0);
  Vec<float,_3UL>::
  generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
  ::anon_class_16_2_94732099::operator()(&local_2b0,1);
  Vec<float,_3UL>::
  generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
  ::anon_class_16_2_94732099::operator()(&local_2b0,2);
  local_2b8 = v.values[0];
  local_2c0[0] = (float)local_294._0_4_;
  local_2c0[1] = (float)local_294._4_4_;
  local_2f8 = v.values[0];
  local_300[0] = (float)local_294._0_4_;
  local_300[1] = (float)local_294._4_4_;
  local_2c8 = v.values[0];
  local_2d0[0] = (float)local_294._0_4_;
  local_2d0[1] = (float)local_294._4_4_;
  local_308 = v.values[0];
  local_310[0] = (float)local_294._0_4_;
  local_310[1] = (float)local_294._4_4_;
  local_7a8.values[2] = v.values[0];
  local_7a8.values[0] = (float)local_294._0_4_;
  local_7a8.values[1] = (float)local_294._4_4_;
  local_650.b = &local_7a8;
  local_518.f = &local_650;
  local_518.v = (Vec<float,_3UL> *)local_4fc;
  v_1.values._4_8_ = &local_518;
  local_650.a = &local_79c;
  local_640 = local_650.b;
  local_638 = &local_79c;
  local_508 = local_518.f;
  Vec<float,_3UL>::
  generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:69:32)>
  ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_1.values._4_8_,0);
  uVar5 = v_1.values._4_8_;
  Vec<float,_3UL>::
  generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:69:32)>
  ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_1.values._4_8_,1);
  Vec<float,_3UL>::
  generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:69:32)>
  ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar5,2);
  local_520 = v_1.values[0];
  local_528[0] = (float)local_4fc._0_4_;
  local_528[1] = (float)local_4fc._4_4_;
  local_658 = v_1.values[0];
  local_660[0] = (float)local_4fc._0_4_;
  local_660[1] = (float)local_4fc._4_4_;
  local_628 = v_1.values[0];
  local_630[0] = (float)local_4fc._0_4_;
  local_630[1] = (float)local_4fc._4_4_;
  local_668 = v_1.values[0];
  local_670[0] = (float)local_4fc._0_4_;
  local_670[1] = (float)local_4fc._4_4_;
  bin_offset.values[1] = (float)local_4fc._0_4_;
  bin_offset.values[2] = (float)local_4fc._4_4_;
  bin_scale.values[0] = v_1.values[0];
  local_790 = local_4fc;
  local_468.f = &local_5b0;
  local_468.v = (Vec<float,_3UL> *)local_44c;
  v_2.values._4_8_ = &local_468;
  local_5b0.a = &bbox->min;
  local_5a8 = bbox;
  local_458 = local_468.f;
  Vec<float,_3UL>::
  generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:59:32)>
  ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_2.values._4_8_,0);
  uVar5 = v_2.values._4_8_;
  Vec<float,_3UL>::
  generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:59:32)>
  ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_2.values._4_8_,1);
  Vec<float,_3UL>::
  generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:59:32)>
  ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar5,2);
  local_5b8 = v_2.values[0];
  local_5c0[0] = (float)local_44c._0_4_;
  local_5c0[1] = (float)local_44c._4_4_;
  local_598 = v_2.values[0];
  local_5a0[0] = (float)local_44c._0_4_;
  local_5a0[1] = (float)local_44c._4_4_;
  local_5c8 = v_2.values[0];
  local_5d0[0] = (float)local_44c._0_4_;
  local_5d0[1] = (float)local_44c._4_4_;
  local_7e0.values[2] = v_2.values[0];
  local_7e0.values[0] = (float)local_44c._0_4_;
  local_7e0.values[1] = (float)local_44c._4_4_;
  local_600.a = &local_7e0;
  local_600.b = (Vec<float,_3UL> *)local_790;
  local_4c0.f = &local_600;
  local_4c0.v = (Vec<float,_3UL> *)local_4a4;
  v_3.values._4_8_ = &local_4c0;
  local_5f0 = local_600.b;
  local_5e8 = local_600.a;
  local_4b0 = local_4c0.f;
  Vec<float,_3UL>::
  generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:64:32)>
  ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_3.values._4_8_,0);
  uVar5 = v_3.values._4_8_;
  Vec<float,_3UL>::
  generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:64:32)>
  ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_3.values._4_8_,1);
  Vec<float,_3UL>::
  generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:64:32)>
  ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar5,2);
  local_608 = v_3.values[0];
  local_610 = local_4a4;
  local_5d8 = v_3.values[0];
  local_5e0 = local_4a4;
  local_618 = v_3.values[0];
  local_620 = local_4a4;
  local_7d4 = local_4a4;
  bin_offset.values[0] = v_3.values[0];
  for (pos.values._4_8_ = begin; (ulong)pos.values._4_8_ < stack0xfffffffffffff880;
      pos.values._4_8_ = pos.values._4_8_ + 1) {
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->prim_ids_,pos.values._4_8_);
    local_570.a = std::span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL>::operator[]
                            (&(this->super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>)
                              .centers_,*pvVar6);
    local_570.b = (Vec<float,_3UL> *)local_790;
    local_570.c = (Vec<float,_3UL> *)local_7d4;
    local_410.f = &local_570;
    local_410.v = (Vec<float,_3UL> *)local_3f4;
    v_4.values._4_8_ = &local_410;
    local_558 = local_570.c;
    local_550 = local_570.b;
    local_548 = local_570.a;
    local_400 = local_410.f;
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:112:32)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_4.values._4_8_,0);
    uVar5 = v_4.values._4_8_;
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:112:32)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_4.values._4_8_,1);
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:112:32)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar5,2);
    local_578 = v_4.values[0];
    local_580 = local_3f4;
    local_538 = v_4.values[0];
    local_540 = local_3f4;
    local_588 = v_4.values[0];
    local_590 = local_3f4;
    local_820 = v_4.values[0];
    local_828 = local_3f4;
    local_814 = local_3f4;
    pos.values[0] = v_4.values[0];
    local_848.pos = (Vec<float,_3UL> *)local_814;
    local_848.i = (size_t *)(pos.values + 1);
    local_530 = &local_848;
    local_848.per_axis_bins =
         (array<std::array<bvh::v2::BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL>::Bin,_8UL>,_3UL>
          *)&largest_axis;
    local_848.this = this;
    fill_bins::anon_class_32_4_337ade70::operator()(local_530,0);
    this_00 = local_530;
    fill_bins::anon_class_32_4_337ade70::operator()(local_530,1);
    fill_bins::anon_class_32_4_337ade70::operator()(this_00,2);
  }
  local_390.a = &bbox->max;
  local_240.f = &local_390;
  local_240.v = (Vec<float,_3UL> *)local_224;
  v_5.values._4_8_ = &local_240;
  local_390.b = &bbox->min;
  local_380 = bbox;
  local_378 = local_390.a;
  local_230 = local_240.f;
  Vec<float,_3UL>::
  generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
  ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_5.values._4_8_,0);
  uVar5 = v_5.values._4_8_;
  Vec<float,_3UL>::
  generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
  ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_5.values._4_8_,1);
  Vec<float,_3UL>::
  generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
  ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar5,2);
  v_7.values[1] = (float)local_224._0_4_;
  v_7.values[2] = (float)local_224._4_4_;
  local_368 = v_5.values[0];
  local_370 = (size_t)local_224;
  best_split.axis = (size_t)local_224;
  local_bac.values[0] = (float)local_224._0_4_;
  local_bac.values[1] = (float)local_224._4_4_;
  local_bac.values[2] = v_5.values[0];
  local_6b0 = &local_bac;
  local_1b8.compare = &local_6b1;
  local_1a0 = 0;
  local_1b8.axis = &local_1a0;
  local_188 = &local_1b8;
  local_1b8.this = local_6b0;
  axis = (size_t)local_1b8.compare;
  local_190 = local_6b0;
  Vec<float,_3UL>::get_best_axis<std::greater<float>_>::anon_class_24_3_cfb3b071::operator()
            (local_188,1);
  local_180 = local_188;
  Vec<float,_3UL>::get_best_axis<std::greater<float>_>::anon_class_24_3_cfb3b071::operator()
            (local_188,2);
  local_178 = local_180;
  local_ba0 = local_1a0;
  axis_1 = 4;
  best_split.bin_id._0_4_ = std::numeric_limits<float>::max();
  best_split._8_8_ = local_ba0;
  for (uStack_be0 = 0; axis_00 = uStack_be0, uStack_be0 < 3; uStack_be0 = uStack_be0 + 1) {
    bins = std::
           array<std::array<bvh::v2::BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL>::Bin,_8UL>,_3UL>
           ::operator[]((array<std::array<bvh::v2::BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL>::Bin,_8UL>,_3UL>
                         *)&largest_axis,uStack_be0);
    find_best_split(this,axis_00,bins,(Split *)&axis_1);
  }
  pCVar2 = (this->super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>).config_;
  local_6a0 = per_axis_bins._M_elems[2]._M_elems[7].prim_count;
  local_a0.a = &bbox->max;
  local_60.f = &local_a0;
  local_60.v = (Vec<float,_3UL> *)local_44;
  v_6.values._4_8_ = &local_60;
  local_6a8 = bbox;
  local_698 = begin;
  local_690 = pCVar2;
  d.values._4_8_ = bbox;
  local_a0.b = &bbox->min;
  local_90 = bbox;
  local_88 = local_a0.a;
  local_50 = local_60.f;
  Vec<float,_3UL>::
  generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
  ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_6.values._4_8_,0);
  uVar5 = v_6.values._4_8_;
  Vec<float,_3UL>::
  generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
  ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_6.values._4_8_,1);
  Vec<float,_3UL>::
  generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
  ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar5,2);
  local_68 = v_6.values[0];
  local_70 = local_44;
  local_78 = v_6.values[0];
  local_80 = local_44;
  local_168 = v_6.values[0];
  local_170 = local_44;
  local_15c = local_44;
  uVar5 = local_15c;
  d.values[0] = v_6.values[0];
  local_15c._0_4_ = local_44._0_4_;
  local_15c._4_4_ = local_44._4_4_;
  auVar4 = vfmadd213ss_fma(ZEXT416((uint)v_6.values[0]),
                           ZEXT416((uint)((float)local_15c + local_15c._4_4_)),
                           ZEXT416((uint)((float)local_15c * local_15c._4_4_)));
  auVar3 = vcvtusi2ss_avx512f(ZEXT416((uint)((float)local_15c + local_15c._4_4_)),
                              (local_6a0 - local_698) + (pCVar2->sah).prim_offset_ >>
                              ((byte)(pCVar2->sah).log_cluster_size_ & 0x3f));
  local_be4 = auVar4._0_4_ * (auVar3._0_4_ - (pCVar2->sah).cost_ratio_);
  local_15c = uVar5;
  if ((float)best_split.bin_id < local_be4) {
    local_340.a = &bbox->max;
    local_278.f = &local_340;
    local_278.v = (Vec<float,_3UL> *)local_25c;
    local_340.b = &bbox->min;
    local_330 = bbox;
    local_328 = local_340.a;
    local_268 = local_278.f;
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
    ::anon_class_16_2_94732099::operator()(&local_278,0);
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
    ::anon_class_16_2_94732099::operator()(&local_278,1);
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
    ::anon_class_16_2_94732099::operator()(&local_278,2);
    v.values[1] = (float)local_25c._0_4_;
    v.values[2] = (float)local_25c._4_4_;
    local_348 = v_7.values[0];
    local_350 = (size_t)local_25c;
    local_318 = v_7.values[0];
    local_320 = (size_t)local_25c;
    local_358 = v_7.values[0];
    local_360 = (size_t)local_25c;
    local_c08 = v_7.values[0];
    index = (size_t)local_25c;
    local_c00 = (size_t)local_25c;
    local_bf8 = v_7.values[0];
    local_860 = &local_c00;
    local_868 = best_split.cost;
    uStack_864 = best_split._12_4_;
    fVar1 = *(float *)((long)local_860 + best_split._8_8_ * 4);
    local_680 = fVar1 / 8.0;
    auVar3 = vcvtusi2ss_avx512f(ZEXT416((uint)fVar1),axis_1);
    local_858 = best_split.cost;
    uStack_854 = best_split._12_4_;
    local_688 = (bbox->min).values[best_split._8_8_];
    local_684 = auVar3._0_4_;
    auVar3 = vfmadd213ss_fma(ZEXT416(local_684),ZEXT416((uint)local_680),ZEXT416((uint)local_688));
    local_bf4 = auVar3._0_4_;
    local_850 = bbox;
    local_c30._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->prim_ids_);
    local_c28 = __gnu_cxx::
                __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator+(&local_c30,begin);
    local_c40._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->prim_ids_);
    local_c38 = (unsigned_long *)
                __gnu_cxx::
                __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator+(&local_c40,per_axis_bins._M_elems[2]._M_elems[7].prim_count);
    local_c50 = &axis_1;
    local_c48 = &local_bf4;
    __pred.best_split = (Split *)local_c50;
    __pred.this = this;
    __pred.split_pos = local_c48;
    local_c58 = this;
    local_c20 = std::
                partition<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,bvh::v2::BinnedSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>,8ul>::try_split(bvh::v2::BBox<float,3ul>const&,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_>
                          (local_c28,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            )local_c38,__pred);
    local_c60._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->prim_ids_);
    local_c18 = __gnu_cxx::operator-(&local_c20,&local_c60);
    if ((local_c18 == begin) || (local_c18 == per_axis_bins._M_elems[2]._M_elems[7].prim_count)) {
      local_c68 = fallback_split(this,local_ba0,begin,
                                 per_axis_bins._M_elems[2]._M_elems[7].prim_count);
      std::optional<unsigned_long>::optional<unsigned_long,_true>
                ((optional<unsigned_long> *)&this_local,&local_c68);
      _Var7._8_8_ = extraout_RDX_01;
      _Var7._M_payload = (_Storage<unsigned_long,_true>)this_local;
    }
    else {
      _Var7 = (_Optional_payload_base<unsigned_long>)std::make_optional<unsigned_long&>(&local_c18);
      local_870 = _Var7._M_engaged;
    }
  }
  else if (((this->super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>).config_)->
           max_leaf_size < per_axis_bins._M_elems[2]._M_elems[7].prim_count - begin) {
    sStack_bf0 = fallback_split(this,local_ba0,begin,
                                per_axis_bins._M_elems[2]._M_elems[7].prim_count);
    std::optional<unsigned_long>::optional<unsigned_long,_true>
              ((optional<unsigned_long> *)&this_local,&stack0xfffffffffffff410);
    _Var7._8_8_ = extraout_RDX_00;
    _Var7._M_payload = (_Storage<unsigned_long,_true>)this_local;
  }
  else {
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)&this_local);
    _Var7._8_8_ = extraout_RDX;
    _Var7._M_payload = (_Storage<unsigned_long,_true>)this_local;
  }
  this_local = (BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL> *)_Var7._M_payload;
  oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = _Var7._9_7_;
  oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = local_870;
  oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload = (_Storage<unsigned_long,_true>)this_local
  ;
  return (optional<unsigned_long>)
         oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> try_split(const BBox& bbox, size_t begin, size_t end) override {
        PerAxisBins per_axis_bins;
        fill_bins(per_axis_bins, bbox, begin, end);

        auto largest_axis = bbox.get_diagonal().get_largest_axis();
        auto best_split = Split { BinCount / 2, std::numeric_limits<Scalar>::max(), largest_axis };
        for (size_t axis = 0; axis < Node::dimension; ++axis)
            find_best_split(axis, per_axis_bins[axis], best_split);

        // Make sure that the split is good before proceeding with it
        auto leaf_cost = config_.sah.get_non_split_cost(begin, end, bbox);
        if (best_split.cost >= leaf_cost) {
            if (end - begin <= config_.max_leaf_size)
                return std::nullopt;
            return fallback_split(largest_axis, begin, end);
        }

        auto split_pos = fast_mul_add(
            bbox.get_diagonal()[best_split.axis] / static_cast<Scalar>(BinCount),
            static_cast<Scalar>(best_split.bin_id),
            bbox.min[best_split.axis]);

        size_t index = std::partition(prim_ids_.begin() + begin, prim_ids_.begin() + end,
            [&] (size_t i) { return centers_[i][best_split.axis] < split_pos; }) - prim_ids_.begin();
        if (index == begin || index == end)
            return fallback_split(largest_axis, begin, end);

        return std::make_optional(index);
    }